

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_count.hpp
# Opt level: O1

weak_count * __thiscall boost::detail::weak_count::operator=(weak_count *this,shared_count *r)

{
  int *piVar1;
  int iVar2;
  sp_counted_base *psVar3;
  sp_counted_base *psVar4;
  
  psVar3 = r->pi_;
  if (psVar3 != this->pi_) {
    if (psVar3 != (sp_counted_base *)0x0) {
      LOCK();
      psVar3->weak_count_ = psVar3->weak_count_ + 1;
      UNLOCK();
    }
    psVar4 = this->pi_;
    if (psVar4 != (sp_counted_base *)0x0) {
      LOCK();
      piVar1 = &psVar4->weak_count_;
      iVar2 = *piVar1;
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (iVar2 == 1) {
        (*psVar4->_vptr_sp_counted_base[3])();
      }
    }
    this->pi_ = psVar3;
  }
  return this;
}

Assistant:

weak_count & operator= (shared_count const & r) // nothrow
    {
        sp_counted_base * tmp = r.pi_;

        if( tmp != pi_ )
        {
            if(tmp != 0) tmp->weak_add_ref();
            if(pi_ != 0) pi_->weak_release();
            pi_ = tmp;
        }

        return *this;
    }